

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void runtest(int n,char *filename1,char *arg2)

{
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  size_t i;
  char *__s1;
  ulong uVar4;
  size_type sVar5;
  iterator iVar6;
  ostream *poVar7;
  FILE *__stream;
  runtime_error *this;
  initializer_list<int> __l;
  initializer_list<std::pair<const_int,_void_(*)(QPDF_&,_const_char_*)>_> __l_00;
  int n_local;
  allocator<char> local_731;
  QPDF pdf;
  shared_ptr<char> file_buf;
  map<int,_void_(*)(QPDF_&,_const_char_*),_std::less<int>,_std::allocator<std::pair<const_int,_void_(*)(QPDF_&,_const_char_*)>_>_>
  test_functions;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  size_t size;
  set<int,_std::less<int>,_std::allocator<int>_> ignore_filename;
  string password;
  
  password.field_2._M_allocated_capacity = 0x5600000055;
  password.field_2._8_8_ = 0x5c00000057;
  password._M_dataplus._M_p = (pointer)0x510000003d;
  password._M_string_length = 0x5400000053;
  __l._M_len = 10;
  __l._M_array = (iterator)&password;
  n_local = n;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            (&ignore_filename,__l,(less<int> *)&test_functions,(allocator_type *)&local_6e8);
  if (n == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&password,anon_var_dwarf_17e3f,(allocator<char> *)&test_functions);
    if (password._M_string_length != 0x20) {
      __assert_fail("password.length() == 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                    ,0xdff,"void runtest(int, const char *, const char *)");
    }
    QPDF::trim_user_password((string *)&password);
    bVar2 = std::operator==(&password,"1234567890123456789012(45678");
    if (!bVar2) {
      __assert_fail("password == \"1234567890123456789012(45678\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                    ,0xe01,"void runtest(int, const char *, const char *)");
    }
    test_functions._M_t._M_impl._0_8_ = 0;
    test_functions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    test_functions._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    iVar3 = QPDFObjectHandle::getTypeCode();
    if (iVar3 != 0) {
      __assert_fail("uninitialized.getTypeCode() == ::ot_uninitialized",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                    ,0xe04,"void runtest(int, const char *, const char *)");
    }
    __s1 = (char *)QPDFObjectHandle::getTypeName();
    iVar3 = strcmp(__s1,"uninitialized");
    if (iVar3 != 0) {
      __assert_fail("strcmp(uninitialized.getTypeName(), \"uninitialized\") == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                    ,0xe05,"void runtest(int, const char *, const char *)");
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &test_functions._M_t._M_impl.super__Rb_tree_header);
    std::__cxx11::string::~string((string *)&password);
  }
  QPDF::QPDF(&pdf);
  file_buf.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  file_buf.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (n_local == 0) {
    QPDF::setAttemptRecovery(SUB81(&pdf,0));
  }
  if (arg2 == (char *)0x0 || 1 < n_local - 0x23U) {
    if (n_local == 0x2d) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&test_functions,filename1,(allocator<char> *)&local_6e8);
      std::operator+(&password,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &test_functions,".obfuscated");
      std::__cxx11::string::~string((string *)&test_functions);
      size = 0;
      QUtil::read_file_into_memory(password._M_dataplus._M_p,(shared_ptr *)&file_buf,&size);
      peVar1 = file_buf.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      for (uVar4 = 0; uVar4 < size; uVar4 = uVar4 + 1) {
        file_buf.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr[uVar4] =
             file_buf.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr[uVar4] ^ 0xcc;
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_6e8,filename1,&local_731);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &test_functions,&local_6e8,".pdf");
      QPDF::processMemoryFile
                ((char *)&pdf,(char *)test_functions._M_t._M_impl._0_8_,(ulong)peVar1,(char *)size);
      std::__cxx11::string::~string((string *)&test_functions);
      std::__cxx11::string::~string((string *)&local_6e8);
LAB_0011444c:
      std::__cxx11::string::~string((string *)&password);
    }
    else {
      sVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::count(&ignore_filename,&n_local);
      if (sVar5 == 0) {
        if (n_local == 0x59) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&password,filename1,(allocator<char> *)&test_functions);
          QPDF::createFromJSON((string *)&pdf);
          goto LAB_0011444c;
        }
        if ((n_local & 1U) == 0) {
          if ((n_local & 2U) == 0) {
            __stream = (FILE *)0x0;
            QPDF::processFile((char *)&pdf,filename1);
          }
          else {
            __stream = (FILE *)QUtil::safe_fopen(filename1,"rb");
            QPDF::processFile((char *)&pdf,(_IO_FILE *)filename1,SUB81(__stream,0),(char *)0x0);
          }
          goto LAB_0011445c;
        }
        password._M_dataplus._M_p = (pointer)0x0;
        QUtil::read_file_into_memory(filename1,(shared_ptr *)&file_buf,(ulong *)&password);
        QPDF::processMemoryFile
                  ((char *)&pdf,filename1,
                   (ulong)file_buf.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   password._M_dataplus._M_p);
      }
    }
  }
  else {
    QPDF::processFile((char *)&pdf,filename1);
  }
  __stream = (FILE *)0x0;
LAB_0011445c:
  memcpy(&password,&DAT_0014f0a0,0x650);
  __l_00._M_len = 0x65;
  __l_00._M_array = (iterator)&password;
  std::
  map<int,_void_(*)(QPDF_&,_const_char_*),_std::less<int>,_std::allocator<std::pair<const_int,_void_(*)(QPDF_&,_const_char_*)>_>_>
  ::map(&test_functions,__l_00,(less<int> *)&local_6e8,(allocator_type *)&size);
  iVar6 = std::
          _Rb_tree<int,_std::pair<const_int,_void_(*)(QPDF_&,_const_char_*)>,_std::_Select1st<std::pair<const_int,_void_(*)(QPDF_&,_const_char_*)>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_(*)(QPDF_&,_const_char_*)>_>_>
          ::find(&test_functions._M_t,&n_local);
  if ((_Rb_tree_header *)iVar6._M_node != &test_functions._M_t._M_impl.super__Rb_tree_header) {
    (*(code *)iVar6._M_node[1]._M_parent)(&pdf,arg2);
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
    }
    poVar7 = std::operator<<((ostream *)&std::cout,"test ");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,n_local);
    poVar7 = std::operator<<(poVar7," done");
    std::endl<char,std::char_traits<char>>(poVar7);
    std::
    _Rb_tree<int,_std::pair<const_int,_void_(*)(QPDF_&,_const_char_*)>,_std::_Select1st<std::pair<const_int,_void_(*)(QPDF_&,_const_char_*)>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_(*)(QPDF_&,_const_char_*)>_>_>
    ::~_Rb_tree(&test_functions._M_t);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&file_buf.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    QPDF::~QPDF(&pdf);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&ignore_filename._M_t);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6e8,"invalid test ",&local_731);
  QUtil::int_to_string_abi_cxx11_((longlong)&size,n_local);
  std::operator+(&password,&local_6e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&size);
  std::runtime_error::runtime_error(this,(string *)&password);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
runtest(int n, char const* filename1, char const* arg2)
{
    // Most tests here are crafted to work on specific files.  Look at
    // the test suite to see how the test is invoked to find the file
    // that the test is supposed to operate on.

    std::set<int> ignore_filename = {61, 81, 83, 84, 85, 86, 87, 92, 95, 96};

    if (n == 0) {
        // Throw in some random test cases that don't fit anywhere
        // else.  This is in addition to whatever else is going on in
        // test 0.

        // The code to trim user passwords looks for 0x28 (which is
        // "(") since it marks the beginning of the padding.  Exercise
        // the code to make sure it skips over 0x28 characters that
        // aren't part of padding.
        std::string password("1234567890123456789012(45678\x28\xbf\x4e\x5e");
        assert(password.length() == 32);
        QPDF::trim_user_password(password);
        assert(password == "1234567890123456789012(45678");

        QPDFObjectHandle uninitialized;
        assert(uninitialized.getTypeCode() == ::ot_uninitialized);
        assert(strcmp(uninitialized.getTypeName(), "uninitialized") == 0);
    }

    QPDF pdf;
    std::shared_ptr<char> file_buf;
    FILE* filep = nullptr;
    if (n == 0) {
        pdf.setAttemptRecovery(false);
    }
    if (((n == 35) || (n == 36)) && (arg2 != nullptr)) {
        // arg2 is password
        pdf.processFile(filename1, arg2);
    } else if (n == 45) {
        // Decode obfuscated files. To obfuscated, run the input file
        // through this perl script, and save the result to
        // filename.obfuscated. This pretends that the input was
        // called filename.pdf and that that file contained the
        // deobfuscated version.

        // undef $/;
        // my @str = split('', <STDIN>);
        // for (my $i = 0; $i < scalar(@str); ++$i)
        // {
        //     $str[$i] = chr(ord($str[$i]) ^ 0xcc);
        // }
        // print(join('', @str));

        std::string filename(std::string(filename1) + ".obfuscated");
        size_t size = 0;
        QUtil::read_file_into_memory(filename.c_str(), file_buf, size);
        char* p = file_buf.get();
        for (size_t i = 0; i < size; ++i) {
            p[i] = static_cast<char>(p[i] ^ 0xcc);
        }
        pdf.processMemoryFile((std::string(filename1) + ".pdf").c_str(), p, size);
    } else if (ignore_filename.count(n)) {
        // Ignore filename argument entirely
    } else if (n == 89) {
        pdf.createFromJSON(filename1);
    } else if (n % 2 == 0) {
        if (n % 4 == 0) {
            QTC::TC("qpdf", "exercise processFile(name)");
            pdf.processFile(filename1);
        } else {
            QTC::TC("qpdf", "exercise processFile(FILE*)");
            filep = QUtil::safe_fopen(filename1, "rb");
            pdf.processFile(filename1, filep, false);
        }
    } else {
        QTC::TC("qpdf", "exercise processMemoryFile");
        size_t size = 0;
        QUtil::read_file_into_memory(filename1, file_buf, size);
        pdf.processMemoryFile(filename1, file_buf.get(), size);
    }

    std::map<int, void (*)(QPDF&, char const*)> test_functions = {
        {0, test_0_1}, {1, test_0_1}, {2, test_2},   {3, test_3},   {4, test_4},    {5, test_5},
        {6, test_6},   {7, test_7},   {8, test_8},   {9, test_9},   {10, test_10},  {11, test_11},
        {12, test_12}, {13, test_13}, {14, test_14}, {15, test_15}, {16, test_16},  {17, test_17},
        {18, test_18}, {19, test_19}, {20, test_20}, {21, test_21}, {22, test_22},  {23, test_23},
        {24, test_24}, {25, test_25}, {26, test_26}, {27, test_27}, {28, test_28},  {29, test_29},
        {30, test_30}, {31, test_31}, {32, test_32}, {33, test_33}, {34, test_34},  {35, test_35},
        {36, test_36}, {37, test_37}, {38, test_38}, {39, test_39}, {40, test_40},  {41, test_41},
        {42, test_42}, {43, test_43}, {44, test_44}, {45, test_45}, {46, test_46},  {47, test_47},
        {48, test_48}, {49, test_49}, {50, test_50}, {51, test_51}, {52, test_52},  {53, test_53},
        {54, test_54}, {55, test_55}, {56, test_56}, {57, test_57}, {58, test_58},  {59, test_59},
        {60, test_60}, {61, test_61}, {62, test_62}, {63, test_63}, {64, test_64},  {65, test_65},
        {66, test_66}, {67, test_67}, {68, test_68}, {69, test_69}, {70, test_70},  {71, test_71},
        {72, test_72}, {73, test_73}, {74, test_74}, {75, test_75}, {76, test_76},  {77, test_77},
        {78, test_78}, {79, test_79}, {80, test_80}, {81, test_81}, {82, test_82},  {83, test_83},
        {84, test_84}, {85, test_85}, {86, test_86}, {87, test_87}, {88, test_88},  {89, test_89},
        {90, test_90}, {91, test_91}, {92, test_92}, {93, test_93}, {94, test_94},  {95, test_95},
        {96, test_96}, {97, test_97}, {98, test_98}, {99, test_99}, {100, test_100}};

    auto fn = test_functions.find(n);
    if (fn == test_functions.end()) {
        throw std::runtime_error(std::string("invalid test ") + QUtil::int_to_string(n));
    }
    (fn->second)(pdf, arg2);

    if (filep) {
        fclose(filep);
    }
    std::cout << "test " << n << " done" << std::endl;
}